

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::print<std::__cxx11::string>
          (ConsoleLogger *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  ConsoleLogger *this_local;
  
  std::operator<<(this->out,(string *)t);
  print(this);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}